

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stresstest.c
# Opt level: O3

int run_tests(int64_t *sizes,int sizes_cnt,int type)

{
  uint size;
  uchar *puVar1;
  ulong uVar2;
  __time_t _Var3;
  __time_t _Var4;
  __suseconds_t _Var5;
  __suseconds_t _Var6;
  int iVar7;
  EVP_PKEY_CTX *pEVar8;
  char **tbs;
  code *tbs_00;
  size_t siglen;
  size_t siglen_00;
  size_t siglen_01;
  size_t siglen_02;
  size_t siglen_03;
  size_t siglen_04;
  size_t siglen_05;
  size_t siglen_06;
  size_t siglen_07;
  size_t siglen_08;
  size_t siglen_09;
  size_t siglen_10;
  size_t siglen_11;
  size_t siglen_12;
  size_t in_R8;
  ulong uVar9;
  uchar *puVar10;
  timeval t;
  uchar *local_80;
  timeval local_78;
  int local_64;
  uchar *local_60;
  int local_54;
  EVP_PKEY_CTX *local_50;
  ulong local_48;
  int64_t *local_40;
  double local_38;
  
  local_40 = sizes;
  pEVar8 = (EVP_PKEY_CTX *)malloc(0x52080);
  tbs = test_names;
  local_64 = type;
  printf("-------\nRunning tests with %s:\n",test_names[type]);
  printf("%-29s","extra.h yysort1_int64");
  if (0 < sizes_cnt) {
    local_48 = (ulong)(uint)sizes_cnt;
    puVar10 = (uchar *)0x0;
    uVar9 = 0;
    local_54 = sizes_cnt;
    local_50 = pEVar8;
    do {
      puVar1 = (uchar *)local_40[uVar9];
      local_60 = puVar10;
      fill((int64_t *)pEVar8,(int)puVar1,local_64);
      gettimeofday(&local_78,(__timezone_ptr_t)0x0);
      _Var5 = local_78.tv_usec;
      _Var3 = local_78.tv_sec;
      yysort1_int64((int64_t *)pEVar8,(size_t)puVar1);
      gettimeofday(&local_78,(__timezone_ptr_t)0x0);
      _Var6 = local_78.tv_usec;
      _Var4 = local_78.tv_sec;
      iVar7 = verify(pEVar8,puVar1,siglen,(uchar *)tbs,in_R8);
      local_80 = local_60;
      if (iVar7 == 0) goto LAB_0010b965;
      puVar10 = (uchar *)((double)local_60 +
                         (((double)_Var4 * 1000000.0 + (double)_Var6) -
                         ((double)_Var3 * 1000000.0 + (double)_Var5)));
      uVar9 = uVar9 + 1;
    } while (local_48 != uVar9);
    printf(" - %s, %10.1f usec\n","ok");
    fflush((FILE *)0x0);
    printf("%-29s","extra.h yysort2_int64");
    pEVar8 = local_50;
    if (0 < local_54) {
      local_80 = (uchar *)0x0;
      uVar9 = 0;
      do {
        puVar10 = (uchar *)local_40[uVar9];
        local_60 = puVar10;
        fill((int64_t *)pEVar8,(int)puVar10,local_64);
        gettimeofday(&local_78,(__timezone_ptr_t)0x0);
        _Var5 = local_78.tv_usec;
        _Var3 = local_78.tv_sec;
        yysort2_int64((int64_t *)pEVar8,(size_t)puVar10);
        gettimeofday(&local_78,(__timezone_ptr_t)0x0);
        _Var6 = local_78.tv_usec;
        _Var4 = local_78.tv_sec;
        iVar7 = verify(pEVar8,local_60,siglen_00,(uchar *)tbs,in_R8);
        if (iVar7 == 0) goto LAB_0010b965;
        local_80 = (uchar *)((double)local_80 +
                            (((double)_Var4 * 1000000.0 + (double)_Var6) -
                            ((double)_Var3 * 1000000.0 + (double)_Var5)));
        uVar9 = uVar9 + 1;
      } while (local_48 != uVar9);
      printf(" - %s, %10.1f usec\n","ok");
      fflush((FILE *)0x0);
      printf("%-29s","extra.h radix_sort7_int64");
      pEVar8 = local_50;
      if (0 < local_54) {
        local_80 = (uchar *)0x0;
        uVar9 = 0;
        do {
          puVar10 = (uchar *)local_40[uVar9];
          local_60 = puVar10;
          fill((int64_t *)pEVar8,(int)puVar10,local_64);
          gettimeofday(&local_78,(__timezone_ptr_t)0x0);
          _Var5 = local_78.tv_usec;
          _Var3 = local_78.tv_sec;
          radix_sort7_int64((int64_t *)pEVar8,(size_t)puVar10);
          gettimeofday(&local_78,(__timezone_ptr_t)0x0);
          _Var6 = local_78.tv_usec;
          _Var4 = local_78.tv_sec;
          iVar7 = verify(pEVar8,local_60,siglen_01,(uchar *)tbs,in_R8);
          if (iVar7 == 0) goto LAB_0010b965;
          local_80 = (uchar *)((double)local_80 +
                              (((double)_Var4 * 1000000.0 + (double)_Var6) -
                              ((double)_Var3 * 1000000.0 + (double)_Var5)));
          uVar9 = uVar9 + 1;
        } while (local_48 != uVar9);
        printf(" - %s, %10.1f usec\n","ok");
        fflush((FILE *)0x0);
        printf("%-29s","sort.h tim_sort");
        pEVar8 = local_50;
        if (0 < local_54) {
          local_80 = (uchar *)0x0;
          uVar9 = 0;
          do {
            puVar10 = (uchar *)local_40[uVar9];
            local_60 = puVar10;
            fill((int64_t *)pEVar8,(int)puVar10,local_64);
            gettimeofday(&local_78,(__timezone_ptr_t)0x0);
            _Var5 = local_78.tv_usec;
            _Var3 = local_78.tv_sec;
            sorter_tim_sort((int64_t *)pEVar8,(size_t)puVar10);
            gettimeofday(&local_78,(__timezone_ptr_t)0x0);
            _Var6 = local_78.tv_usec;
            _Var4 = local_78.tv_sec;
            iVar7 = verify(pEVar8,local_60,siglen_02,(uchar *)tbs,in_R8);
            if (iVar7 == 0) goto LAB_0010b965;
            local_80 = (uchar *)((double)local_80 +
                                (((double)_Var4 * 1000000.0 + (double)_Var6) -
                                ((double)_Var3 * 1000000.0 + (double)_Var5)));
            uVar9 = uVar9 + 1;
          } while (local_48 != uVar9);
          printf(" - %s, %10.1f usec\n","ok");
          fflush((FILE *)0x0);
          printf("%-29s","sort.h quick_sort");
          pEVar8 = local_50;
          if (0 < local_54) {
            local_80 = (uchar *)0x0;
            uVar9 = 0;
            do {
              uVar2 = local_40[uVar9];
              fill((int64_t *)pEVar8,(int)uVar2,local_64);
              gettimeofday(&local_78,(__timezone_ptr_t)0x0);
              local_38 = (double)local_78.tv_usec;
              local_60 = (uchar *)((double)local_78.tv_sec * 1000000.0);
              if (1 < uVar2) {
                sorter_quick_sort_recursive((int64_t *)pEVar8,0,uVar2 - 1);
              }
              gettimeofday(&local_78,(__timezone_ptr_t)0x0);
              _Var5 = local_78.tv_usec;
              _Var3 = local_78.tv_sec;
              iVar7 = verify(pEVar8,(uchar *)(uVar2 & 0xffffffff),siglen_03,(uchar *)tbs,in_R8);
              if (iVar7 == 0) goto LAB_0010b965;
              local_80 = (uchar *)((double)local_80 +
                                  (((double)_Var3 * 1000000.0 + (double)_Var5) -
                                  ((double)local_60 + local_38)));
              uVar9 = uVar9 + 1;
            } while (local_48 != uVar9);
            printf(" - %s, %10.1f usec\n",local_80,"ok");
            fflush((FILE *)0x0);
            printf("%-29s","extra.h std_sort_int64");
            pEVar8 = local_50;
            if (0 < local_54) {
              local_80 = (uchar *)0x0;
              uVar9 = 0;
              do {
                puVar10 = (uchar *)local_40[uVar9];
                local_60 = puVar10;
                fill((int64_t *)pEVar8,(int)puVar10,local_64);
                gettimeofday(&local_78,(__timezone_ptr_t)0x0);
                _Var5 = local_78.tv_usec;
                _Var3 = local_78.tv_sec;
                std_sort_int64((int64_t *)pEVar8,(size_t)puVar10);
                gettimeofday(&local_78,(__timezone_ptr_t)0x0);
                _Var6 = local_78.tv_usec;
                _Var4 = local_78.tv_sec;
                iVar7 = verify(pEVar8,local_60,siglen_04,(uchar *)tbs,in_R8);
                if (iVar7 == 0) goto LAB_0010b965;
                local_80 = (uchar *)((double)local_80 +
                                    (((double)_Var4 * 1000000.0 + (double)_Var6) -
                                    ((double)_Var3 * 1000000.0 + (double)_Var5)));
                uVar9 = uVar9 + 1;
              } while (local_48 != uVar9);
              printf(" - %s, %10.1f usec\n","ok");
              fflush((FILE *)0x0);
              printf("%-29s","extra.h std_stable_int64");
              pEVar8 = local_50;
              if (0 < local_54) {
                local_80 = (uchar *)0x0;
                uVar9 = 0;
                do {
                  puVar10 = (uchar *)local_40[uVar9];
                  local_60 = puVar10;
                  fill((int64_t *)pEVar8,(int)puVar10,local_64);
                  gettimeofday(&local_78,(__timezone_ptr_t)0x0);
                  _Var5 = local_78.tv_usec;
                  _Var3 = local_78.tv_sec;
                  std_stable_int64((int64_t *)pEVar8,(size_t)puVar10);
                  gettimeofday(&local_78,(__timezone_ptr_t)0x0);
                  _Var6 = local_78.tv_usec;
                  _Var4 = local_78.tv_sec;
                  iVar7 = verify(pEVar8,local_60,siglen_05,(uchar *)tbs,in_R8);
                  if (iVar7 == 0) goto LAB_0010b965;
                  local_80 = (uchar *)((double)local_80 +
                                      (((double)_Var4 * 1000000.0 + (double)_Var6) -
                                      ((double)_Var3 * 1000000.0 + (double)_Var5)));
                  uVar9 = uVar9 + 1;
                } while (local_48 != uVar9);
                printf(" - %s, %10.1f usec\n","ok");
                fflush((FILE *)0x0);
                printf("%-29s","sort.h heap_sort");
                pEVar8 = local_50;
                if (0 < local_54) {
                  local_80 = (uchar *)0x0;
                  uVar9 = 0;
                  do {
                    puVar10 = (uchar *)local_40[uVar9];
                    local_60 = puVar10;
                    fill((int64_t *)pEVar8,(int)puVar10,local_64);
                    gettimeofday(&local_78,(__timezone_ptr_t)0x0);
                    _Var5 = local_78.tv_usec;
                    _Var3 = local_78.tv_sec;
                    sorter_heap_sort((int64_t *)pEVar8,(size_t)puVar10);
                    gettimeofday(&local_78,(__timezone_ptr_t)0x0);
                    _Var6 = local_78.tv_usec;
                    _Var4 = local_78.tv_sec;
                    iVar7 = verify(pEVar8,local_60,siglen_06,(uchar *)tbs,in_R8);
                    if (iVar7 == 0) goto LAB_0010b965;
                    local_80 = (uchar *)((double)local_80 +
                                        (((double)_Var4 * 1000000.0 + (double)_Var6) -
                                        ((double)_Var3 * 1000000.0 + (double)_Var5)));
                    uVar9 = uVar9 + 1;
                  } while (local_48 != uVar9);
                  printf(" - %s, %10.1f usec\n","ok");
                  fflush((FILE *)0x0);
                  printf("%-29s","sort.h merge_sort");
                  pEVar8 = local_50;
                  if (0 < local_54) {
                    local_80 = (uchar *)0x0;
                    uVar9 = 0;
                    do {
                      puVar10 = (uchar *)local_40[uVar9];
                      local_60 = puVar10;
                      fill((int64_t *)pEVar8,(int)puVar10,local_64);
                      gettimeofday(&local_78,(__timezone_ptr_t)0x0);
                      _Var5 = local_78.tv_usec;
                      _Var3 = local_78.tv_sec;
                      sorter_merge_sort((int64_t *)pEVar8,(size_t)puVar10);
                      gettimeofday(&local_78,(__timezone_ptr_t)0x0);
                      _Var6 = local_78.tv_usec;
                      _Var4 = local_78.tv_sec;
                      iVar7 = verify(pEVar8,local_60,siglen_07,(uchar *)tbs,in_R8);
                      if (iVar7 == 0) goto LAB_0010b965;
                      local_80 = (uchar *)((double)local_80 +
                                          (((double)_Var4 * 1000000.0 + (double)_Var6) -
                                          ((double)_Var3 * 1000000.0 + (double)_Var5)));
                      uVar9 = uVar9 + 1;
                    } while (local_48 != uVar9);
                    printf(" - %s, %10.1f usec\n",local_80,"ok");
                    fflush((FILE *)0x0);
                    printf("%-29s","sort.h shell_sort");
                    pEVar8 = local_50;
                    if (0 < local_54) {
                      local_80 = (uchar *)0x0;
                      uVar9 = 0;
                      do {
                        puVar10 = (uchar *)local_40[uVar9];
                        local_60 = puVar10;
                        fill((int64_t *)pEVar8,(int)puVar10,local_64);
                        gettimeofday(&local_78,(__timezone_ptr_t)0x0);
                        _Var5 = local_78.tv_usec;
                        _Var3 = local_78.tv_sec;
                        sorter_shell_sort((int64_t *)pEVar8,(size_t)puVar10);
                        gettimeofday(&local_78,(__timezone_ptr_t)0x0);
                        _Var6 = local_78.tv_usec;
                        _Var4 = local_78.tv_sec;
                        iVar7 = verify(pEVar8,local_60,siglen_08,(uchar *)tbs,in_R8);
                        if (iVar7 == 0) goto LAB_0010b965;
                        local_80 = (uchar *)((double)local_80 +
                                            (((double)_Var4 * 1000000.0 + (double)_Var6) -
                                            ((double)_Var3 * 1000000.0 + (double)_Var5)));
                        uVar9 = uVar9 + 1;
                      } while (local_48 != uVar9);
                      printf(" - %s, %10.1f usec\n",local_80,"ok");
                      fflush((FILE *)0x0);
                      printf("%-29s","sort.h merge_sort_in_place");
                      pEVar8 = local_50;
                      if (0 < local_54) {
                        local_80 = (uchar *)0x0;
                        uVar9 = 0;
                        do {
                          puVar10 = (uchar *)local_40[uVar9];
                          local_60 = puVar10;
                          fill((int64_t *)pEVar8,(int)puVar10,local_64);
                          gettimeofday(&local_78,(__timezone_ptr_t)0x0);
                          _Var5 = local_78.tv_usec;
                          _Var3 = local_78.tv_sec;
                          sorter_merge_sort_in_place((int64_t *)pEVar8,(size_t)puVar10);
                          gettimeofday(&local_78,(__timezone_ptr_t)0x0);
                          _Var6 = local_78.tv_usec;
                          _Var4 = local_78.tv_sec;
                          iVar7 = verify(pEVar8,local_60,siglen_09,(uchar *)tbs,in_R8);
                          if (iVar7 == 0) goto LAB_0010b965;
                          local_80 = (uchar *)((double)local_80 +
                                              (((double)_Var4 * 1000000.0 + (double)_Var6) -
                                              ((double)_Var3 * 1000000.0 + (double)_Var5)));
                          uVar9 = uVar9 + 1;
                        } while (local_48 != uVar9);
                        printf(" - %s, %10.1f usec\n",local_80,"ok");
                        fflush((FILE *)0x0);
                        printf("%-29s","sort.h grail_sort");
                        pEVar8 = local_50;
                        if (0 < local_54) {
                          local_80 = (uchar *)0x0;
                          uVar9 = 0;
                          do {
                            size = *(uint *)(local_40 + uVar9);
                            fill((int64_t *)pEVar8,size,local_64);
                            gettimeofday(&local_78,(__timezone_ptr_t)0x0);
                            _Var3 = local_78.tv_sec;
                            local_60 = (uchar *)local_78.tv_usec;
                            puVar10 = (uchar *)0x0;
                            sorter_grail_common_sort((int64_t *)pEVar8,size,(int64_t *)0x0,0);
                            gettimeofday(&local_78,(__timezone_ptr_t)0x0);
                            _Var5 = local_78.tv_usec;
                            _Var4 = local_78.tv_sec;
                            iVar7 = verify(pEVar8,(uchar *)(ulong)size,siglen_10,puVar10,in_R8);
                            if (iVar7 == 0) goto LAB_0010b965;
                            local_80 = (uchar *)((double)local_80 +
                                                (((double)_Var4 * 1000000.0 + (double)_Var5) -
                                                ((double)_Var3 * 1000000.0 + (double)(long)local_60)
                                                ));
                            uVar9 = uVar9 + 1;
                          } while (local_48 != uVar9);
                          printf(" - %s, %10.1f usec\n",local_80,"ok");
                          fflush((FILE *)0x0);
                          printf("%-29s","sort.h sqrt_sort");
                          pEVar8 = local_50;
                          if (0 < local_54) {
                            local_80 = (uchar *)0x0;
                            uVar9 = 0;
                            do {
                              puVar1 = (uchar *)local_40[uVar9];
                              local_60 = puVar1;
                              fill((int64_t *)pEVar8,(int)puVar1,local_64);
                              gettimeofday(&local_78,(__timezone_ptr_t)0x0);
                              _Var5 = local_78.tv_usec;
                              _Var3 = local_78.tv_sec;
                              sorter_sqrt_sort((int64_t *)pEVar8,(size_t)puVar1);
                              gettimeofday(&local_78,(__timezone_ptr_t)0x0);
                              _Var6 = local_78.tv_usec;
                              _Var4 = local_78.tv_sec;
                              iVar7 = verify(pEVar8,local_60,siglen_11,puVar10,in_R8);
                              if (iVar7 == 0) goto LAB_0010b965;
                              local_80 = (uchar *)((double)local_80 +
                                                  (((double)_Var4 * 1000000.0 + (double)_Var6) -
                                                  ((double)_Var3 * 1000000.0 + (double)_Var5)));
                              uVar9 = uVar9 + 1;
                            } while (local_48 != uVar9);
                            printf(" - %s, %10.1f usec\n",local_80,"ok");
                            fflush((FILE *)0x0);
                            printf("%-29s","stdlib qsort");
                            pEVar8 = local_50;
                            if (0 < local_54) {
                              local_80 = (uchar *)0x0;
                              uVar9 = 0;
                              while( true ) {
                                uVar2 = local_40[uVar9];
                                fill((int64_t *)pEVar8,(int)uVar2,local_64);
                                gettimeofday(&local_78,(__timezone_ptr_t)0x0);
                                _Var3 = local_78.tv_sec;
                                local_60 = (uchar *)local_78.tv_usec;
                                tbs_00 = simple_cmp;
                                qsort(pEVar8,uVar2,8,simple_cmp);
                                gettimeofday(&local_78,(__timezone_ptr_t)0x0);
                                _Var5 = local_78.tv_usec;
                                _Var4 = local_78.tv_sec;
                                iVar7 = verify(pEVar8,(uchar *)(uVar2 & 0xffffffff),siglen_12,
                                               (uchar *)tbs_00,in_R8);
                                if (iVar7 == 0) break;
                                local_80 = (uchar *)((double)local_80 +
                                                    (((double)_Var4 * 1000000.0 + (double)_Var5) -
                                                    ((double)_Var3 * 1000000.0 +
                                                    (double)(long)local_60)));
                                uVar9 = uVar9 + 1;
                                if (local_48 == uVar9) {
                                  printf(" - %s, %10.1f usec\n",local_80,"ok");
                                  fflush((FILE *)0x0);
                                  free(local_50);
                                  return 0;
                                }
                              }
                              goto LAB_0010b965;
                            }
                          }
                        }
                      }
                    }
                  }
                  local_80 = (uchar *)0x0;
                  goto LAB_0010b965;
                }
              }
            }
          }
        }
      }
    }
  }
  local_80 = (uchar *)0x0;
LAB_0010b965:
  printf(" - %s, %10.1f usec\n",local_80,"FAILED");
  fflush((FILE *)0x0);
  return 0;
}

Assistant:

int run_tests(int64_t *sizes, int sizes_cnt, int type) {
  int test, res;
  double usec1, usec2, diff;
  int64_t *dst = (int64_t *)malloc(MAXSIZE * sizeof(int64_t));
  printf("-------\nRunning tests with %s:\n", test_names[type]);
  TEST_EXTRA_H(yysort1_int64);
  TEST_EXTRA_H(yysort2_int64);
  // TEST_EXTRA_H(yysort1_int64_sb);
  // TEST_EXTRA_H(yysort2_int64_sb);
  // TEST_EXTRA_H(sort_rela589n_int64);
  TEST_EXTRA_H(radix_sort7_int64);

  TEST_SORT_H(tim_sort);
  TEST_SORT_H(quick_sort);
  TEST_EXTRA_H(std_sort_int64);
  TEST_EXTRA_H(std_stable_int64);
  TEST_SORT_H(heap_sort);
  TEST_SORT_H(merge_sort);
  TEST_SORT_H(shell_sort);
  TEST_SORT_H(merge_sort_in_place);
  TEST_SORT_H(grail_sort);
  TEST_SORT_H(sqrt_sort);
  // TEST_SORT_H(rec_stable_sort);
  // TEST_SORT_H(grail_sort_dyn_buffer);

  TEST_STDLIB(qsort);
#if !defined(__linux__) && !defined(__CYGWIN__)
  TEST_STDLIB(heapsort);
  TEST_STDLIB(mergesort);
#endif

  if (MAXSIZE < 10000) {
    TEST_SORT_H(selection_sort);
    TEST_SORT_H(bubble_sort);
    TEST_SORT_H(binary_insertion_sort);
    TEST_SORT_H(bitonic_sort);
  }
  free(dst);
  return 0;
}